

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

bool Memory::Recycler::WBCheckIsRecyclerAddress(char *addr)

{
  HeapBlock *pHVar1;
  HeapBlock *heapBlock;
  Recycler *recycler;
  AutoCriticalSection lock;
  char *addr_local;
  
  lock.cs = (CriticalSection *)addr;
  AutoCriticalSection::AutoCriticalSection((AutoCriticalSection *)&recycler,&recyclerListLock);
  heapBlock = (HeapBlock *)recyclerList;
  do {
    if (heapBlock == (HeapBlock *)0x0) {
      addr_local._7_1_ = false;
LAB_009acff7:
      AutoCriticalSection::~AutoCriticalSection((AutoCriticalSection *)&recycler);
      return addr_local._7_1_;
    }
    pHVar1 = FindHeapBlock((Recycler *)heapBlock,(void *)((ulong)lock.cs & 0xfffffffffffffff0));
    if (pHVar1 != (HeapBlock *)0x0) {
      addr_local._7_1_ = true;
      goto LAB_009acff7;
    }
    heapBlock = *(HeapBlock **)&heapBlock[0xb36].heapBlockType;
  } while( true );
}

Assistant:

bool
Recycler::WBCheckIsRecyclerAddress(char* addr)
{
    AutoCriticalSection lock(&recyclerListLock);
    Recycler* recycler = Recycler::recyclerList;
    while (recycler)
    {
        auto heapBlock = recycler->FindHeapBlock((void*)((UINT_PTR)addr&~HeapInfo::ObjectAlignmentMask));
        if (heapBlock)
        {
            return true;
        }
        recycler = recycler->next;
    }
    return false;
}